

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int64_t mtree_atol(char **p,wchar_t base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  wchar_t wVar9;
  char cVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  
  pcVar6 = *p;
  if (base == L'\0') {
    cVar10 = *pcVar6;
    base = L'\n';
    if (cVar10 != '0') goto LAB_0014e270;
    if ((byte)(pcVar6[1] | 0x20U) == 0x78) {
      pcVar6 = pcVar6 + 2;
      *p = pcVar6;
      base = L'\x10';
      goto LAB_0014e26d;
    }
    base = L'\b';
    uVar7 = 8;
    lVar3 = 0xfffffffffffffff;
    wVar9 = L'\a';
    iVar8 = 0x30;
  }
  else {
LAB_0014e26d:
    cVar10 = *pcVar6;
LAB_0014e270:
    uVar7 = CONCAT44(0,base);
    if (cVar10 == '-') {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000);
      lVar3 = SUB168(auVar2 / auVar1,0);
      *p = pcVar6 + 1;
      cVar10 = pcVar6[1];
      iVar8 = (int)cVar10;
      if ((byte)(cVar10 - 0x30U) < 10) {
        wVar9 = iVar8 + L'\xffffffd0';
      }
      else if ((byte)(cVar10 + 0x9fU) < 6) {
        wVar9 = iVar8 + L'\xffffff9f';
      }
      else {
        wVar9 = L'\xffffffff';
        if ((byte)(cVar10 + 0xbfU) < 6) {
          wVar9 = iVar8 + L'\xffffffbf';
        }
      }
      if (base <= wVar9 || wVar9 < L'\0') {
        return 0;
      }
      lVar5 = -lVar3;
      pcVar6 = pcVar6 + 2;
      lVar4 = 0;
      while( true ) {
        if (SBORROW8(lVar4,lVar5) != lVar4 + lVar3 < 0) {
          return -0x8000000000000000;
        }
        if ((lVar4 == lVar5) && (SUB164(auVar2 % auVar1,0) <= wVar9)) break;
        *p = pcVar6;
        cVar10 = *pcVar6;
        iVar8 = (int)cVar10;
        if ((byte)(cVar10 - 0x30U) < 10) {
          wVar11 = iVar8 + L'\xffffffd0';
        }
        else if ((byte)(cVar10 + 0x9fU) < 6) {
          wVar11 = iVar8 + L'\xffffff9f';
        }
        else {
          wVar11 = iVar8 + L'\xffffffbf';
          if (5 < (byte)(cVar10 + 0xbfU)) {
            wVar11 = L'\xffffffff';
          }
        }
        lVar4 = lVar4 * uVar7 - (ulong)(uint)wVar9;
        if (wVar11 < L'\0') {
          return lVar4;
        }
        pcVar6 = pcVar6 + 1;
        wVar9 = wVar11;
        if (base <= wVar11) {
          return lVar4;
        }
      }
      return -0x8000000000000000;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar7;
    auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
    lVar3 = SUB168(auVar1 / auVar2,0);
    wVar9 = SUB164(auVar1 % auVar2,0);
    iVar8 = (int)cVar10;
    if (9 < (byte)(cVar10 - 0x30U)) {
      if ((byte)(cVar10 + 0x9fU) < 6) {
        wVar11 = iVar8 + L'\xffffff9f';
      }
      else {
        wVar11 = iVar8 + L'\xffffffbf';
        if (5 < (byte)(cVar10 + 0xbfU)) {
          wVar11 = L'\xffffffff';
        }
      }
      goto LAB_0014e40c;
    }
  }
  wVar11 = iVar8 + L'\xffffffd0';
LAB_0014e40c:
  if (base <= wVar11 || wVar11 < L'\0') {
    return 0;
  }
  lVar4 = 0;
  while( true ) {
    pcVar6 = pcVar6 + 1;
    if (lVar3 < lVar4) {
      return 0x7fffffffffffffff;
    }
    if ((lVar4 == lVar3) && (wVar9 < wVar11)) break;
    *p = pcVar6;
    cVar10 = *pcVar6;
    iVar8 = (int)cVar10;
    if ((byte)(cVar10 - 0x30U) < 10) {
      wVar12 = iVar8 + L'\xffffffd0';
    }
    else if ((byte)(cVar10 + 0x9fU) < 6) {
      wVar12 = iVar8 + L'\xffffff9f';
    }
    else {
      wVar12 = iVar8 + L'\xffffffbf';
      if (5 < (byte)(cVar10 + 0xbfU)) {
        wVar12 = L'\xffffffff';
      }
    }
    lVar4 = (ulong)(uint)wVar11 + lVar4 * uVar7;
    if (wVar12 < L'\0') {
      return lVar4;
    }
    wVar11 = wVar12;
    if (base <= wVar12) {
      return lVar4;
    }
  }
  return 0x7fffffffffffffff;
}

Assistant:

static int64_t
mtree_atol(char **p, int base)
{
	int64_t l, limit;
	int digit, last_digit_limit;

	if (base == 0) {
		if (**p != '0')
			base = 10;
		else if ((*p)[1] == 'x' || (*p)[1] == 'X') {
			*p += 2;
			base = 16;
		} else {
			base = 8;
		}
	}

	if (**p == '-') {
		limit = INT64_MIN / base;
		last_digit_limit = -(INT64_MIN % base);
		++(*p);

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l < limit || (l == limit && digit >= last_digit_limit))
				return INT64_MIN;
			l = (l * base) - digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	} else {
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l > limit || (l == limit && digit > last_digit_limit))
				return INT64_MAX;
			l = (l * base) + digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	}
}